

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::clearBufferuiv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,deUint32 *value)

{
  bool bVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  byte bVar4;
  ConstPixelBufferAccess *pCVar5;
  byte bVar6;
  int x;
  long lVar7;
  int iVar8;
  ConstPixelBufferAccess *pCVar9;
  int y;
  int iVar10;
  int iVar11;
  MultisamplePixelBufferAccess access;
  Vector<int,_4> res;
  UVec4 color;
  MultisamplePixelBufferAccess colorBuf;
  int local_d0;
  MultisampleConstPixelBufferAccess local_c0;
  TextureFormat local_98;
  undefined8 uStack_90;
  TextureFormat local_88;
  undefined8 uStack_80;
  undefined1 local_78 [72];
  
  if (buffer == 0x1800) {
    if (drawbuffer == 0) {
      if (this->m_scissorEnabled == true) {
        iVar11 = (this->m_scissorBox).m_data[3];
        iVar8 = (this->m_scissorBox).m_data[2];
        iVar10 = (this->m_scissorBox).m_data[0];
        local_d0 = (this->m_scissorBox).m_data[1];
      }
      else {
        local_d0 = 0;
        iVar11 = 0x7fffffff;
        iVar8 = 0x7fffffff;
        iVar10 = 0;
      }
      getDrawColorbuffer((MultisamplePixelBufferAccess *)(local_78 + 0x10),this);
      bVar1 = (this->m_colorMask).m_data[0];
      bVar4 = 1;
      if (((bVar1 == true) && ((this->m_colorMask).m_data[1] == true)) &&
         ((this->m_colorMask).m_data[2] == true)) {
        bVar4 = (this->m_colorMask).m_data[3] ^ 1;
      }
      bVar6 = 0;
      if (bVar1 == false) {
        if (((this->m_colorMask).m_data[1] == false) && ((this->m_colorMask).m_data[2] == false)) {
          bVar6 = (this->m_colorMask).m_data[3] ^ 1;
        }
        else {
          bVar6 = 0;
        }
      }
      rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                (&local_c0,(MultisamplePixelBufferAccess *)(local_78 + 0x10));
      x = 0;
      if (0 < iVar10) {
        x = iVar10;
      }
      y = 0;
      if (0 < local_d0) {
        y = local_d0;
      }
      iVar2 = iVar8 + iVar10;
      if (local_c0.m_access.m_size.m_data[1] <= iVar8 + iVar10) {
        iVar2 = local_c0.m_access.m_size.m_data[1];
      }
      iVar8 = iVar11 + local_d0;
      if (local_c0.m_access.m_size.m_data[2] <= iVar11 + local_d0) {
        iVar8 = local_c0.m_access.m_size.m_data[2];
      }
      if (((0 < iVar2 - x) && (0 < iVar8 - y)) && (bVar6 == 0)) {
        rr::getSubregion((MultisamplePixelBufferAccess *)&local_c0,
                         (MultisamplePixelBufferAccess *)(local_78 + 0x10),x,y,iVar2 - x,iVar8 - y);
        local_78._0_4_ = value[0];
        local_78._4_4_ = value[1];
        local_78._8_8_ = *(undefined8 *)(value + 2);
        if (bVar4 == 0) {
          local_88 = (TextureFormat)local_78._0_8_;
          uStack_80 = local_78._8_8_;
          rr::clear((MultisamplePixelBufferAccess *)&local_c0,(IVec4 *)&local_88);
        }
        else if (0 < local_c0.m_access.m_size.m_data[2]) {
          iVar11 = 0;
          do {
            if (0 < local_c0.m_access.m_size.m_data[1]) {
              iVar8 = 0;
              do {
                if (0 < local_c0.m_access.m_size.m_data[0]) {
                  iVar10 = 0;
                  do {
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)(local_78 + 0x38),(int)&local_c0,iVar10,
                               iVar8);
                    local_98.order = R;
                    local_98.type = SNORM_INT8;
                    uStack_90 = 0;
                    pCVar3 = (ConstPixelBufferAccess *)local_78;
                    lVar7 = 0;
                    pCVar5 = (ConstPixelBufferAccess *)(local_78 + 0x38);
                    do {
                      pCVar9 = pCVar5;
                      if ((this->m_colorMask).m_data[lVar7] != false) {
                        pCVar9 = pCVar3;
                      }
                      (&local_98.order)[lVar7] = (pCVar9->m_format).order;
                      lVar7 = lVar7 + 1;
                      pCVar5 = (ConstPixelBufferAccess *)&(pCVar5->m_format).type;
                      pCVar3 = (ConstPixelBufferAccess *)&(pCVar3->m_format).type;
                    } while (lVar7 != 4);
                    local_88 = local_98;
                    uStack_80 = uStack_90;
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)&local_c0,(IVec4 *)&local_88,iVar10,iVar8,iVar11
                              );
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < local_c0.m_access.m_size.m_data[0]);
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < local_c0.m_access.m_size.m_data[1]);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < local_c0.m_access.m_size.m_data[2]);
        }
      }
    }
    else if (this->m_lastError == 0) {
      this->m_lastError = 0x501;
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferuiv (deUint32 buffer, int drawbuffer, const deUint32* value)
{
	RC_IF_ERROR(buffer != GL_COLOR, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	TCU_CHECK_INTERNAL(buffer == GL_COLOR);
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			tcu::UVec4							color		(value[0], value[1], value[2], value[3]);

			if (!maskUsed)
				rr::clear(access, color.asInt());
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixelUint(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
}